

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

bool tinyusdz::GeomSubset::ValidateSubsets
               (vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                *subsets,size_t elementCount,FamilyType *familyType,string *err)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  bool bVar4;
  long *plVar5;
  long lVar6;
  _Base_ptr args;
  ElementType v;
  ElementType v_00;
  pointer pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  bool bVar8;
  pointer piVar9;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar10;
  size_t maxIndex;
  int32_t index;
  Animatable<std::vector<int,_std::allocator<int>_>_> indices;
  int minIndex;
  set<int,_std::less<int>,_std::allocator<int>_> indicesInFamily;
  stringstream ss;
  string local_2b8;
  string local_298;
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_258;
  undefined1 local_248 [32];
  vector<int,_std::allocator<int>_> local_228;
  string *local_208;
  pointer local_200;
  long *local_1f8;
  long *local_1f0;
  undefined1 local_1e8 [32];
  _Base_ptr local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  plVar5 = *(long **)subsets;
  if (plVar5 != *(long **)(subsets + 8)) {
    uVar1 = *(uint *)(*plVar5 + 0xc2c + (ulong)(*(byte *)(*plVar5 + 0xc28) ^ 1) * 8);
    do {
      lVar6 = *plVar5;
      local_278._0_8_ = elementCount;
      local_200 = (pointer)elementCount;
      if (*(uint *)(lVar6 + 0xc2c + (ulong)(*(byte *)(lVar6 + 0xc28) ^ 1) * 8) != uVar1) {
        if (err != (string *)0x0) {
          local_268._M_allocated_capacity = (size_type)&aStack_258;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_268,
                     "GeomSubset {}\'s elementType must be `{}`, but got `{}`.\n","");
          tinyusdz::to_string_abi_cxx11_((string *)local_1e8,(tinyusdz *)(ulong)uVar1,v);
          tinyusdz::to_string_abi_cxx11_
                    (&local_2b8,
                     (tinyusdz *)
                     (ulong)*(uint *)(lVar6 + 0xc2c + (ulong)(*(byte *)(lVar6 + 0xc28) ^ 1) * 8),
                     v_00);
          fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_1b8,(fmt *)local_268._M_local_buf,(string *)(lVar6 + 0x9d8),
                     (string *)local_1e8,&local_2b8,in_R9);
          std::__cxx11::string::operator=((string *)err,(string *)local_1b8);
          if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
            operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
            operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_allocated_capacity != &aStack_258) {
            operator_delete((void *)local_268._M_allocated_capacity,
                            CONCAT62(aStack_258._2_6_,aStack_258._M_allocated_capacity._0_2_) + 1);
          }
        }
        return false;
      }
      plVar5 = plVar5 + 1;
    } while (plVar5 != *(long **)(subsets + 8));
    args = (_Base_ptr)(local_1e8 + 8);
    local_1e8._8_4_ = _S_red;
    local_1e8._16_8_ = (_Link_type)0x0;
    local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_208 = err;
    local_1e8._24_8_ = args;
    local_1c8 = args;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    plVar5 = *(long **)subsets;
    local_1f8 = *(long **)(subsets + 8);
    if (plVar5 == local_1f8) {
      bVar8 = true;
    }
    else {
      bVar8 = true;
      do {
        lVar6 = *plVar5;
        local_248[0x10] = 0;
        local_248._17_8_ = 0;
        local_248._0_8_ = (pointer)0x0;
        local_248[8] = 0;
        local_248._9_7_ = 0;
        aStack_258._M_allocated_capacity._0_2_ = 0;
        aStack_258._2_6_ = 0;
        aStack_258._M_local_buf[8] = 0;
        aStack_258._M_local_buf[9] = 0;
        local_268._M_allocated_capacity = 0;
        local_268._8_2_ = 0;
        local_268._10_6_ = 0;
        bVar4 = TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::
                get_value((TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                           *)(lVar6 + 0xe98),
                          (Animatable<std::vector<int,_std::allocator<int>_>_> *)&local_268);
        if (!bVar4) {
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_298,
                     "GeomSubset {}\'s indices is not value Attribute. Connection or ValueBlock?\n",
                     "");
          fmt::format<std::__cxx11::string>
                    (&local_2b8,(fmt *)&local_298,(string *)(lVar6 + 0x9d8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),local_2b8._M_dataplus._M_p,
                     local_2b8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          bVar8 = false;
        }
        if (aStack_258._M_local_buf[9] == 1) {
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_298,"GeomSubset {}\'s indices is Value Blocked.\n","");
          fmt::format<std::__cxx11::string>
                    (&local_2b8,(fmt *)&local_298,(string *)(lVar6 + 0x9d8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),local_2b8._M_dataplus._M_p,
                     local_2b8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          bVar8 = false;
        }
        if ((aStack_258._M_local_buf[8] & 1U) == 0) {
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_298,
                     "ValidateSubsets: TimeSampled GeomSubset.indices is not yet supported.\n","");
          fmt::format(&local_2b8,&local_298);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),local_2b8._M_dataplus._M_p,
                     local_2b8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          bVar8 = false;
        }
        local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_1f0 = plVar5;
        if (((aStack_258._M_local_buf[9] & 1U) == 0) && (aStack_258._M_local_buf[8] == 1)) {
          std::vector<int,_std::allocator<int>_>::operator=
                    (&local_228,(vector<int,_std::allocator<int>_> *)&local_268);
        }
        else {
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_298,
                     "ValidateSubsets: Internal error. Failed to get GeomSubset.indices.\n","");
          fmt::format(&local_2b8,&local_298);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),local_2b8._M_dataplus._M_p,
                     local_2b8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          bVar8 = false;
        }
        piVar3 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          piVar9 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            local_278._12_4_ = *piVar9;
            pVar10 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                     _M_insert_unique<int_const&>
                               ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                 *)local_1e8,(int *)(local_278 + 0xc));
            if ((((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (*familyType != Unrestricted)) {
              local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_298,"Found overlapping index {} in GeomSubset `{}`\n","");
              args = (_Base_ptr)(lVar6 + 0x9d8);
              fmt::format<int,std::__cxx11::string>
                        (&local_2b8,(fmt *)&local_298,(string *)(local_278 + 0xc),
                         (int *)(lVar6 + 0x9d8),in_R8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),local_2b8._M_dataplus._M_p,
                         local_2b8._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                operator_delete(local_2b8._M_dataplus._M_p,
                                local_2b8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_298._M_dataplus._M_p != &local_298.field_2) {
                operator_delete(local_298._M_dataplus._M_p,
                                local_298.field_2._M_allocated_capacity + 1);
              }
              bVar8 = false;
            }
            piVar9 = piVar9 + 1;
          } while (piVar9 != piVar3);
        }
        if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
        ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                   *)local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_268._M_allocated_capacity,
                          CONCAT62(aStack_258._2_6_,aStack_258._M_allocated_capacity._0_2_) -
                          local_268._0_8_);
        }
        plVar5 = local_1f0 + 1;
      } while (plVar5 != local_1f8);
    }
    pcVar7 = local_200;
    if ((*familyType == Partition) &&
       (local_1c0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200)) {
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b8,
                 "ValidateSubsets: The number of unique indices {} must be equal to input elementCount {}\n"
                 ,"");
      local_298._M_dataplus._M_p = (pointer)local_1c0;
      fmt::format<unsigned_long,unsigned_long>
                ((string *)&local_268,(fmt *)&local_2b8,&local_298,(unsigned_long *)local_278,
                 (unsigned_long *)in_R8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),(char *)local_268._M_allocated_capacity,
                 CONCAT62(local_268._10_6_,local_268._8_2_));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_allocated_capacity != &aStack_258) {
        operator_delete((void *)local_268._M_allocated_capacity,
                        CONCAT62(aStack_258._2_6_,aStack_258._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      bVar8 = false;
      pcVar7 = (pointer)local_278._0_8_;
    }
    lVar6 = std::_Rb_tree_decrement((_Rb_tree_node_base *)(local_1e8 + 8));
    local_298._M_dataplus._M_p = (pointer)(long)*(int *)(lVar6 + 0x20);
    iVar2 = *(int *)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_1e8._24_8_ + 0x20))->_M_dataplus)._M_p;
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,iVar2);
    if (pcVar7 <= local_298._M_dataplus._M_p) {
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b8,
                 "ValidateSubsets: All indices must be in range [0, elementSize {}), but one or more indices are greater than elementSize. Maximum = {}\n"
                 ,"");
      fmt::format<unsigned_long,unsigned_long>
                ((string *)&local_268,(fmt *)&local_2b8,(string *)local_278,
                 (unsigned_long *)&local_298,(unsigned_long *)in_R8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),(char *)local_268._M_allocated_capacity,
                 CONCAT62(local_268._10_6_,local_268._8_2_));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_allocated_capacity != &aStack_258) {
        operator_delete((void *)local_268._M_allocated_capacity,
                        CONCAT62(aStack_258._2_6_,aStack_258._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      bVar8 = false;
    }
    if (iVar2 < 0) {
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b8,
                 "ValidateSubsets: Found one or more indices that are less than 0. Minumum = {}\n",
                 "");
      fmt::format<int>((string *)&local_268,&local_2b8,(int *)&local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),(char *)local_268._M_allocated_capacity,
                 CONCAT62(local_268._10_6_,local_268._8_2_));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_allocated_capacity != &aStack_258) {
        operator_delete((void *)local_268._M_allocated_capacity,
                        CONCAT62(aStack_258._2_6_,aStack_258._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      bVar8 = false;
    }
    if ((local_208 != (string *)0x0) && (!bVar8)) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_208,local_268._M_allocated_capacity);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_allocated_capacity != &aStack_258) {
        operator_delete((void *)local_268._M_allocated_capacity,
                        CONCAT62(aStack_258._2_6_,aStack_258._M_allocated_capacity._0_2_) + 1);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_1e8,(_Link_type)local_1e8._16_8_);
  }
  return true;
}

Assistant:

bool GeomSubset::ValidateSubsets(
    const std::vector<const GeomSubset *> &subsets,
    const size_t elementCount,
    const FamilyType &familyType, std::string *err) {

  if (subsets.empty()) {
    return true;
  }

  // All subsets must have the same elementType.
  GeomSubset::ElementType elementType = subsets[0]->elementType.get_value();
  for (const auto psubset : subsets) {
    if (psubset->elementType.get_value() != elementType) {
      if (err) {
        (*err) = fmt::format("GeomSubset {}'s elementType must be `{}`, but got `{}`.\n",
          psubset->name, to_string(elementType), to_string(psubset->elementType.get_value()));
      }

      return false;
    }
  }

  std::set<int32_t> indicesInFamily;

  bool valid = true;
  std::stringstream ss;

  // TODO: TimeSampled indices
  for (const auto psubset : subsets) {
    Animatable<std::vector<int32_t>> indices;
    if (!psubset->indices.get_value(&indices)) {
      ss << fmt::format("GeomSubset {}'s indices is not value Attribute. Connection or ValueBlock?\n",
          psubset->name);

      valid = false;
    }

    if (indices.is_blocked()) {
      ss << fmt::format("GeomSubset {}'s indices is Value Blocked.\n", psubset->name);
      valid = false;
    }

    if (indices.is_timesamples() || !indices.has_value()) {
      ss << fmt::format("ValidateSubsets: TimeSampled GeomSubset.indices is not yet supported.\n");
      valid = false;
    }

    std::vector<int32_t> subsetIndices;
    if (!indices.get_scalar(&subsetIndices)) {
      ss << fmt::format("ValidateSubsets: Internal error. Failed to get GeomSubset.indices.\n");
      valid = false;
    }

    for (const int32_t index : subsetIndices) {
      if (!indicesInFamily.insert(index).second && (familyType != FamilyType::Unrestricted)) {
        ss << fmt::format("Found overlapping index {} in GeomSubset `{}`\n", index, psubset->name);
        valid = false;
      }
    }
  }


  // Make sure every index appears exactly once if it's a partition.
  if ((familyType == FamilyType::Partition) && (indicesInFamily.size() != elementCount)) {
    ss << fmt::format("ValidateSubsets: The number of unique indices {} must be equal to input elementCount {}\n", indicesInFamily.size(), elementCount);
    valid = false;
  }

  // Ensure that the indices are in the range [0, faceCount)
  size_t maxIndex = static_cast<size_t>(*indicesInFamily.rbegin());
  int minIndex = *indicesInFamily.begin();

  if (maxIndex >= elementCount) {
    ss << fmt::format("ValidateSubsets: All indices must be in range [0, elementSize {}), but one or more indices are greater than elementSize. Maximum = {}\n", elementCount, maxIndex);

    valid = false;
  }

  if (minIndex < 0) {
    ss << fmt::format("ValidateSubsets: Found one or more indices that are less than 0. Minumum = {}\n", minIndex);

    valid = false;
  }

  if (!valid) {
    if (err) {
      (*err) += ss.str();
    }
  }

  return true;

}